

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O1

char * __thiscall glcts::TessellationShaderBarrier2::getTCSCode(TessellationShaderBarrier2 *this)

{
  return 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 4) out;\n\n      out float tcs_result[];\npatch out int   test_patch_value;\n\nvoid main()\n{\n    if (gl_InvocationID == 0)\n    {\n        test_patch_value = 123;\n    }\n\n    barrier();\n\n    if (gl_InvocationID == 1)\n    {\n        test_patch_value = 234;\n    }\n\n    barrier();\n\n    tcs_result[gl_InvocationID] = 2.0;\n\n    if (gl_InvocationID == 0)\n    {\n        if (test_patch_value == 234)\n        {\n            tcs_result[gl_InvocationID] = 1.0;\n        }\n    }\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n}\n"
  ;
}

Assistant:

const char* TessellationShaderBarrier2::getTCSCode()
{
	static const char* tcs_code = "${VERSION}\n"
								  "\n"
								  "${TESSELLATION_SHADER_REQUIRE}\n"
								  "\n"
								  "layout (vertices = 4) out;\n"
								  "\n"
								  "      out float tcs_result[];\n"
								  "patch out int   test_patch_value;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  /* Four invocations per input patch will be executed. Have the first one write its
		 * secret value to the output per-patch attribute.
		 */
								  "    if (gl_InvocationID == 0)\n"
								  "    {\n"
								  "        test_patch_value = 123;\n"
								  "    }\n"
								  "\n"
								  "    barrier();\n"
								  "\n"
								  /* Let's have the second invocation update the value at this point */
								  "    if (gl_InvocationID == 1)\n"
								  "    {\n"
								  "        test_patch_value = 234;\n"
								  "    }\n"
								  "\n"
								  "    barrier();\n"
								  "\n"
								  /* Finally, if this is invocation number one, check if test_patch_value
		 * stores a correct value.
		 */
								  "    tcs_result[gl_InvocationID] = 2.0;\n"
								  "\n"
								  "    if (gl_InvocationID == 0)\n"
								  "    {\n"
								  "        if (test_patch_value == 234)\n"
								  "        {\n"
								  "            tcs_result[gl_InvocationID] = 1.0;\n"
								  "        }\n"
								  "    }\n"
								  "\n"
								  "    gl_TessLevelOuter[0] = 1.0;\n"
								  "    gl_TessLevelOuter[1] = 1.0;\n"
								  "}\n";

	return tcs_code;
}